

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O3

void saslmechanism_destroy(SASL_MECHANISM_HANDLE sasl_mechanism)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (sasl_mechanism != (SASL_MECHANISM_HANDLE)0x0) {
    (*sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy)
              (sasl_mechanism->concrete_sasl_mechanism_handle);
    free(sasl_mechanism);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_mechanism.c"
               ,"saslmechanism_destroy",0x48,1,"NULL sasl_mechanism");
    return;
  }
  return;
}

Assistant:

void saslmechanism_destroy(SASL_MECHANISM_HANDLE sasl_mechanism)
{
    if (sasl_mechanism == NULL)
    {
        /* Codes_SRS_SASL_MECHANISM_01_009: [If the argument `sasl_mechanism` is NULL, `saslmechanism_destroy` shall do nothing.] */
        LogError("NULL sasl_mechanism");
    }
    else
    {
        /* Codes_SRS_SASL_MECHANISM_01_008: [`saslmechanism_destroy` shall also call the `concrete_sasl_mechanism_destroy` function that is member of the `sasl_mechanism_interface_description` argument passed to `saslmechanism_create`, while passing as argument to `concrete_sasl_mechanism_destroy` the result of the underlying concrete SASL mechanism handle.] */
        sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy(sasl_mechanism->concrete_sasl_mechanism_handle);

        /* Codes_SRS_SASL_MECHANISM_01_007: [`saslmechanism_destroy` shall free all resources associated with the SASL mechanism handle.] */
        free(sasl_mechanism);
    }
}